

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkCallNullable(CheckerVisitor *this,CallExpr *call)

{
  Node *n;
  bool bVar1;
  _func_int **pp_Var2;
  
  if ((this->effectsOnly == false) && (call->_nullable == false)) {
    n = &call->_callee->super_Node;
    bVar1 = isPotentiallyNullable(this,(Expr *)n);
    if (bVar1) {
      if (n->_op == TO_ID) {
        pp_Var2 = n[1].super_ArenaObj._vptr_ArenaObj;
      }
      else {
        pp_Var2 = (_func_int **)0x180467;
      }
      report(this,n,0x5f,pp_Var2,"function");
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallNullable(const CallExpr *call) {
  if (effectsOnly)
    return;

  const Expr *c = call->callee();

  if (!call->isNullable() && isPotentiallyNullable(c)) {
    report(c, DiagnosticsId::DI_ACCESS_POT_NULLABLE, c->op() == TO_ID ? c->asId()->id() : "expression", "function");
  }
}